

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlsa_digital_filter_coefficients_to_mel_cepstrum.cc
# Opt level: O1

bool __thiscall
sptk::MlsaDigitalFilterCoefficientsToMelCepstrum::Run
          (MlsaDigitalFilterCoefficientsToMelCepstrum *this,
          vector<double,_std::allocator<double>_> *mlsa_digital_filter_coefficients,
          vector<double,_std::allocator<double>_> *mel_cepstrum)

{
  pointer __src;
  pointer pdVar1;
  long lVar2;
  size_t __n;
  bool bVar3;
  size_type __new_size;
  
  if (this->is_valid_ == true) {
    bVar3 = false;
    if ((mel_cepstrum != (vector<double,_std::allocator<double>_> *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar3 = false,
       (long)(mlsa_digital_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(mlsa_digital_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)
             ._M_impl.super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(mel_cepstrum,__new_size);
      }
      __src = (mlsa_digital_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>
              )._M_impl.super__Vector_impl_data._M_start;
      if ((this->alpha_ != 0.0) || (NAN(this->alpha_))) {
        pdVar1 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar2 = (long)this->num_order_;
        pdVar1[lVar2] = __src[lVar2];
        bVar3 = true;
        if (0 < lVar2) {
          lVar2 = lVar2 + 1;
          do {
            pdVar1[lVar2 + -2] = this->alpha_ * __src[lVar2 + -1] + __src[lVar2 + -2];
            lVar2 = lVar2 + -1;
          } while (1 < lVar2);
        }
      }
      else {
        bVar3 = true;
        __n = (long)(mlsa_digital_filter_coefficients->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove((mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,__src,__n);
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MlsaDigitalFilterCoefficientsToMelCepstrum::Run(
    const std::vector<double>& mlsa_digital_filter_coefficients,
    std::vector<double>* mel_cepstrum) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      mlsa_digital_filter_coefficients.size() !=
          static_cast<std::size_t>(length) ||
      NULL == mel_cepstrum) {
    return false;
  }

  // Prepare memories.
  if (mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    mel_cepstrum->resize(length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    std::copy(mlsa_digital_filter_coefficients.begin(),
              mlsa_digital_filter_coefficients.end(), mel_cepstrum->begin());
    return true;
  }

  const double* b(&(mlsa_digital_filter_coefficients[0]));
  double* c(&((*mel_cepstrum)[0]));

  c[num_order_] = b[num_order_];
  for (int m(num_order_ - 1); 0 <= m; --m) {
    c[m] = b[m] + alpha_ * b[m + 1];
  }

  return true;
}